

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_connect(Curl_easy *data,_Bool *asyncp,_Bool *protocol_done)

{
  urlpieces *part;
  char **ppcVar1;
  undefined1 *puVar2;
  char **ppcVar3;
  char **ppcVar4;
  char **passwordp;
  ushort uVar5;
  hsts *h;
  curl_slist *pcVar6;
  curl_trc_feat *pcVar7;
  altsvcinfo *asi;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  void *pvVar11;
  undefined4 uVar12;
  _Bool _Var13;
  http_majors hVar14;
  byte bVar15;
  CURLUcode CVar16;
  int iVar17;
  CURLcode CVar18;
  NETRCcode ret;
  CURLcode CVar19;
  resolve_t rVar20;
  connectdata *conn;
  ulong uVar21;
  char *pcVar22;
  CURLU *u;
  size_t sVar23;
  size_t sVar24;
  stsentry *psVar25;
  Curl_handler *pCVar26;
  ulong uVar27;
  byte *pbVar28;
  char *pcVar29;
  long lVar30;
  timediff_t tVar31;
  Curl_dns_entry *pCVar32;
  Curl_addrinfo *pCVar33;
  byte bVar34;
  uint uVar35;
  ConnectBits CVar36;
  byte bVar37;
  ulong uVar38;
  byte *__s;
  char *pcVar39;
  byte *pbVar40;
  char **ppcVar41;
  connectdata *conn_00;
  char *pcVar42;
  hostname *host;
  byte *pbVar43;
  bool bVar44;
  curltime cVar45;
  curltime newer;
  curltime older;
  curl_slist **local_b8;
  char *local_b0;
  char *newurl;
  Curl_easy *pCStack_90;
  connectdata *local_88;
  undefined8 uStack_80;
  curl_proxytype local_74;
  hostname *local_70;
  char *local_68;
  _Bool *local_60;
  proxy_info *local_58;
  undefined8 local_50;
  char *local_48;
  _Bool *local_40;
  char *local_38;
  
  *asyncp = false;
  Curl_req_hard_reset(&data->req,data);
  *asyncp = false;
  if ((data->state).url == (char *)0x0) {
    return CURLE_URL_MALFORMAT;
  }
  conn = (connectdata *)(*Curl_ccalloc)(1,0x578);
  if (conn == (connectdata *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  conn->sock[0] = -1;
  conn->sock[1] = -1;
  conn->sockfd = -1;
  conn->writesockfd = -1;
  conn->connection_id = -1;
  (conn->primary).remote_port = -1;
  conn->remote_port = -1;
  CVar18 = CURLE_UNSUPPORTED_PROTOCOL;
  Curl_conncontrol(conn,1);
  cVar45 = Curl_now();
  (conn->created).tv_sec = cVar45.tv_sec;
  (conn->created).tv_usec = cVar45.tv_usec;
  (conn->keepalive).tv_sec = (conn->created).tv_sec;
  (conn->keepalive).tv_usec = (conn->created).tv_usec;
  *(undefined4 *)&(conn->keepalive).field_0xc = *(undefined4 *)&(conn->created).field_0xc;
  bVar15 = (data->set).proxytype;
  (conn->http_proxy).proxytype = bVar15;
  (conn->socks_proxy).proxytype = '\x04';
  pcVar22 = (data->set).str[0x26];
  if ((pcVar22 == (char *)0x0) || (*pcVar22 == '\0')) {
    uVar21 = 0;
    uVar27 = 0;
    uVar38 = 0;
  }
  else {
    uVar27 = 0x10;
    uVar21 = (ulong)(bVar15 < 4);
    uVar38 = (ulong)((uint)(bVar15 >= 4) * 2);
  }
  CVar36 = (ConnectBits)((ulong)conn->bits & 0xffffffffffffffec | uVar21 | uVar27 | uVar38);
  conn->bits = CVar36;
  pcVar22 = (data->set).str[0x27];
  if ((pcVar22 != (char *)0x0) && (*pcVar22 != '\0')) {
    CVar36 = (ConnectBits)((ulong)CVar36 | 0x12);
    conn->bits = CVar36;
  }
  CVar36 = (ConnectBits)
           (((ulong)CVar36 & 0xfffffffffffffffb) +
           (ulong)((data->state).aptr.proxyuser != (char *)0x0) * 4);
  conn->bits = CVar36;
  uVar27 = (ulong)(*(uint *)&(data->set).field_0x894 >> 8 & 8);
  conn->bits = (ConnectBits)((ulong)CVar36 & 0xfffffffffffffff7 | uVar27);
  uVar21 = (ulong)(*(uint *)&(data->set).field_0x894 >> 1 & 0x8000);
  conn->bits = (ConnectBits)((ulong)CVar36 & 0xffffffffffff7ff7 | uVar27 | uVar21);
  conn->bits = (ConnectBits)
               ((ulong)CVar36 & 0xfffffffffffe7ff7 | uVar27 | uVar21 |
               (ulong)(*(uint *)&(data->set).field_0x894 >> 1 & 0x10000));
  conn->ip_version = (data->set).ipver;
  conn->connect_only = (data->set).field_0x894 & 1;
  conn->transport = '\x03';
  Curl_llist_init(&conn->easyq,(Curl_llist_dtor)0x0);
  pcVar22 = (data->set).str[0x1e];
  if (pcVar22 != (char *)0x0) {
    pcVar22 = (*Curl_cstrdup)(pcVar22);
    conn->localdev = pcVar22;
    if (pcVar22 == (char *)0x0) {
      (*Curl_cfree)((void *)0x0);
      (*Curl_cfree)(conn);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  conn->localportrange = (data->set).localportrange;
  conn->localport = (data->set).localport;
  pvVar11 = (data->set).closesocket_client;
  conn->fclosesocket = (data->set).fclosesocket;
  conn->closesocket_client = pvVar11;
  iVar17 = (conn->created).tv_usec;
  uVar12 = *(undefined4 *)&(conn->created).field_0xc;
  (conn->lastused).tv_sec = (conn->created).tv_sec;
  (conn->lastused).tv_usec = iVar17;
  *(undefined4 *)&(conn->lastused).field_0xc = uVar12;
  if ((data->set).uh == (CURLU *)0x0) {
    bVar44 = false;
  }
  else {
    bVar44 = ((data->state).field_0x7be & 8) == 0;
  }
  local_60 = asyncp;
  local_40 = protocol_done;
  up_free(data);
  if (bVar44) {
    u = curl_url_dup((data->set).uh);
  }
  else {
    u = curl_url();
  }
  (data->state).uh = u;
  CVar19 = CURLE_OUT_OF_MEMORY;
  if (u == (CURLU *)0x0) goto switchD_0015b81d_caseD_5;
  if (((data->set).str[0x1d] != (char *)0x0) &&
     (sVar23 = Curl_is_absolute_url((data->state).url,(char *)0x0,0,true), sVar23 == 0)) {
    pcVar22 = curl_maprintf("%s://%s",(data->set).str[0x1d],(data->state).url);
    if (pcVar22 != (char *)0x0) {
      uVar35 = *(uint *)&(data->state).field_0x7be;
      if ((uVar35 >> 0x10 & 1) != 0) {
        (*Curl_cfree)((data->state).url);
        uVar35 = *(uint *)&(data->state).field_0x7be;
      }
      (data->state).url = pcVar22;
      *(uint *)&(data->state).field_0x7be = uVar35 | 0x10000;
      goto LAB_0015b7de;
    }
    goto switchD_0015b81d_caseD_7;
  }
LAB_0015b7de:
  if (!bVar44) {
    uVar35 = (uint)((ulong)*(undefined8 *)&(data->set).field_0x894 >> 0x20);
    CVar16 = curl_url_set(u,CURLUPART_URL,(data->state).url,
                          (uVar35 >> 0xc & 0x20) + (uVar35 >> 7 & 0x10) + 0x208);
    if (CVar16 == CURLUE_OK) {
      CVar16 = curl_url_get(u,CURLUPART_URL,&newurl,0);
      CVar19 = CURLE_URL_MALFORMAT;
      switch(CVar16) {
      case CURLUE_OK:
        uVar35 = *(uint *)&(data->state).field_0x7be;
        if ((uVar35 >> 0x10 & 1) != 0) {
          (*Curl_cfree)((data->state).url);
          uVar35 = *(uint *)&(data->state).field_0x7be;
        }
        (data->state).url = newurl;
        *(uint *)&(data->state).field_0x7be = uVar35 | 0x10000;
        goto LAB_0015b7e7;
      default:
        goto switchD_0015b81d_caseD_5;
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_0015b916_caseD_5;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_0015b81d_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_0015b81d_caseD_8;
      }
    }
    pcVar22 = curl_url_strerror(CVar16);
    Curl_failf(data,"URL rejected: %s",pcVar22);
    if (CVar16 - CURLUE_UNSUPPORTED_SCHEME < 4) {
      CVar19 = *(CURLcode *)(&DAT_0017c928 + (ulong)(CVar16 - CURLUE_UNSUPPORTED_SCHEME) * 4);
      goto switchD_0015b81d_caseD_5;
    }
    goto switchD_0015bcac_caseD_1;
  }
LAB_0015b7e7:
  part = &(data->state).up;
  CVar19 = CURLE_UNSUPPORTED_PROTOCOL;
  CVar16 = curl_url_get(u,CURLUPART_SCHEME,&part->scheme,0);
  switch(CVar16) {
  case CURLUE_OK:
    ppcVar1 = &(data->state).up.hostname;
    CVar16 = curl_url_get(u,CURLUPART_HOST,ppcVar1,0);
    if (CVar16 == CURLUE_OK) {
      pcVar22 = *ppcVar1;
      sVar24 = strlen(pcVar22);
      if (0xffff < sVar24) {
        Curl_failf(data,"Too long hostname (maximum is %d)",0xffff);
        goto switchD_0015b81d_caseD_1;
      }
LAB_0015b987:
      if (pcVar22 == (char *)0x0) {
        pcVar42 = (char *)0x0;
      }
      else {
        pcVar42 = pcVar22;
        if (*pcVar22 == '[') {
          puVar2 = &(conn->bits).field_0x1;
          *puVar2 = *puVar2 | 4;
          pcVar42 = pcVar22 + 1;
          sVar24 = strlen(pcVar42);
          pcVar22[sVar24] = '\0';
          zonefrom_url(u,data,conn);
        }
      }
      local_48 = "";
      if (pcVar42 == (char *)0x0) {
        pcVar42 = "";
      }
      pcVar22 = (*Curl_cstrdup)(pcVar42);
      (conn->host).rawalloc = pcVar22;
      if (pcVar22 == (char *)0x0) goto switchD_0015b81d_caseD_7;
      host = &conn->host;
      (conn->host).name = pcVar22;
      CVar18 = Curl_idnconvert_hostname(host);
      if (CVar18 != CURLE_OK) goto LAB_0015ba07;
      if ((data->hsts != (hsts *)0x0) && (iVar17 = curl_strequal("http",part->scheme), iVar17 != 0))
      {
        h = data->hsts;
        pcVar22 = (conn->host).name;
        local_70 = host;
        sVar24 = strlen(pcVar22);
        host = local_70;
        psVar25 = Curl_hsts(h,pcVar22,sVar24,true);
        if (psVar25 != (stsentry *)0x0) {
          (*Curl_cfree)(part->scheme);
          part->scheme = (char *)0x0;
          CVar16 = curl_url_set(u,CURLUPART_SCHEME,"https",0);
          CVar18 = CURLE_URL_MALFORMAT;
          switch(CVar16) {
          case CURLUE_OK:
            if (((data->state).field_0x7c0 & 1) != 0) {
              (*Curl_cfree)((data->state).url);
              (data->state).url = (char *)0x0;
            }
            CVar16 = curl_url_get(u,CURLUPART_URL,&newurl,0);
            switch(CVar16) {
            case CURLUE_OK:
              CVar16 = curl_url_get(u,CURLUPART_SCHEME,&part->scheme,0);
              if (CVar16 == CURLUE_OK) {
                (data->state).url = newurl;
                puVar2 = &(data->state).field_0x7c0;
                *puVar2 = *puVar2 | 1;
                host = local_70;
                if ((((data->set).field_0x897 & 0x40) != 0) &&
                   ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar7->log_level)))) {
                  Curl_infof(data,"Switched from HTTP to HTTPS due to HSTS => %s");
                  host = local_70;
                }
                goto LAB_0015bba0;
              }
              (*Curl_cfree)(newurl);
              if (CVar16 - CURLUE_UNSUPPORTED_SCHEME < 4) {
                CVar18 = *(CURLcode *)
                          (&DAT_0017c928 + (ulong)(CVar16 - CURLUE_UNSUPPORTED_SCHEME) * 4);
              }
              break;
            case CURLUE_UNSUPPORTED_SCHEME:
              goto switchD_0015bac5_caseD_5;
            case CURLUE_OUT_OF_MEMORY:
              goto switchD_0015bac5_caseD_7;
            case CURLUE_USER_NOT_ALLOWED:
              goto switchD_0015bac5_caseD_8;
            }
            break;
          case CURLUE_UNSUPPORTED_SCHEME:
switchD_0015bac5_caseD_5:
            CVar18 = CURLE_UNSUPPORTED_PROTOCOL;
            break;
          case CURLUE_OUT_OF_MEMORY:
switchD_0015bac5_caseD_7:
            CVar18 = CURLE_OUT_OF_MEMORY;
            break;
          case CURLUE_USER_NOT_ALLOWED:
switchD_0015bac5_caseD_8:
            CVar18 = CURLE_LOGIN_DENIED;
          }
switchD_0015b916_caseD_5:
          CVar19 = CVar18;
          goto switchD_0015b81d_caseD_5;
        }
      }
LAB_0015bba0:
      pcVar22 = part->scheme;
      pCVar26 = Curl_get_scheme_handler(pcVar22);
      if (pCVar26 == (Curl_handler *)0x0) {
        pcVar42 = "not supported";
      }
      else {
        pcVar42 = "disabled";
        if ((((data->set).allowed_protocols & pCVar26->protocol) != 0) &&
           ((((data->state).field_0x7be & 8) == 0 ||
            (((data->set).redir_protocols & pCVar26->protocol) != 0)))) {
          conn->given = pCVar26;
          conn->handler = pCVar26;
          ppcVar1 = &(data->state).aptr.passwd;
          local_70 = host;
          if (((data->state).aptr.passwd == (char *)0x0) ||
             ((*(uint *)&(data->state).field_0x7be & 3) != 2)) {
            ppcVar3 = &(data->state).up.password;
            CVar16 = curl_url_get(u,CURLUPART_PASSWORD,ppcVar3,0);
            switch(CVar16) {
            case CURLUE_UNSUPPORTED_SCHEME:
              goto switchD_0015b81d_caseD_5;
            case CURLUE_URLDECODE:
            case CURLUE_UNKNOWN_PART:
            case CURLUE_NO_SCHEME:
            case CURLUE_NO_USER:
switchD_0015b81d_caseD_1:
              CVar19 = CURLE_URL_MALFORMAT;
              goto switchD_0015b81d_caseD_5;
            case CURLUE_OUT_OF_MEMORY:
              goto switchD_0015b81d_caseD_7;
            case CURLUE_USER_NOT_ALLOWED:
              goto switchD_0015b81d_caseD_8;
            case CURLUE_NO_PASSWORD:
              goto switchD_0015bc52_caseD_c;
            default:
              if (CVar16 != CURLUE_OK) goto switchD_0015b81d_caseD_1;
              CVar18 = Curl_urldecode(*ppcVar3,0,&newurl,(size_t *)0x0,
                                      ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
              if (CVar18 == CURLE_OK) {
                conn->passwd = newurl;
                CVar18 = Curl_setstropt(ppcVar1,newurl);
                if (CVar18 == CURLE_OK) {
                  *(uint *)&(data->state).field_0x7be =
                       (*(uint *)&(data->state).field_0x7be & 0xfffffffc) + 1;
                  goto switchD_0015bc52_caseD_c;
                }
              }
            }
            goto LAB_0015ba07;
          }
switchD_0015bc52_caseD_c:
          ppcVar3 = &(data->state).aptr.user;
          if (((data->state).aptr.user == (char *)0x0) ||
             ((*(uint *)&(data->state).field_0x7be & 3) != 2)) {
            ppcVar4 = &(data->state).up.user;
            CVar16 = curl_url_get(u,CURLUPART_USER,ppcVar4,0);
            switch(CVar16) {
            case CURLUE_OK:
              CVar18 = Curl_urldecode(*ppcVar4,0,&newurl,(size_t *)0x0,
                                      ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
              if (CVar18 == CURLE_OK) {
                conn->user = newurl;
                CVar18 = Curl_setstropt(ppcVar3,newurl);
                *(uint *)&(data->state).field_0x7be =
                     (*(uint *)&(data->state).field_0x7be & 0xfffffffc) + 1;
                if (CVar18 == CURLE_OK) goto switchD_0015bcac_caseD_b;
              }
              break;
            default:
              goto switchD_0015bcac_caseD_1;
            case CURLUE_UNSUPPORTED_SCHEME:
              goto switchD_0015b81d_caseD_5;
            case CURLUE_OUT_OF_MEMORY:
              goto switchD_0015b81d_caseD_7;
            case CURLUE_USER_NOT_ALLOWED:
              goto switchD_0015b81d_caseD_8;
            case CURLUE_NO_USER:
              goto switchD_0015bcac_caseD_b;
            }
            goto LAB_0015ba07;
          }
switchD_0015bcac_caseD_b:
          ppcVar4 = &(data->state).up.options;
          CVar16 = curl_url_get(u,CURLUPART_OPTIONS,ppcVar4,0x40);
          switch(CVar16) {
          case CURLUE_UNSUPPORTED_SCHEME:
            goto switchD_0015b81d_caseD_5;
          case CURLUE_URLDECODE:
          case CURLUE_UNKNOWN_PART:
          case CURLUE_NO_SCHEME:
          case CURLUE_NO_USER:
          case CURLUE_NO_PASSWORD:
switchD_0015bcac_caseD_1:
            CVar19 = CURLE_URL_MALFORMAT;
            goto switchD_0015b81d_caseD_5;
          case CURLUE_OUT_OF_MEMORY:
            break;
          case CURLUE_USER_NOT_ALLOWED:
            goto switchD_0015b81d_caseD_8;
          case CURLUE_NO_OPTIONS:
switchD_0015bd3e_caseD_d:
            CVar16 = curl_url_get(u,CURLUPART_PATH,&(data->state).up.path,0x80);
            switch(CVar16) {
            case CURLUE_OK:
              ppcVar4 = &(data->state).up.port;
              CVar16 = curl_url_get(u,CURLUPART_PORT,ppcVar4,1);
              if (CVar16 == CURLUE_OK) {
                uVar5 = (data->set).use_port;
                uVar35 = (uint)uVar5;
                if ((uVar5 == 0) || (((data->state).field_0x7be & 0x40) == 0)) {
                  local_38 = *ppcVar4;
                  iVar17 = Curl_str_number(&local_38,(curl_off_t *)&newurl,0xffff);
                  if (iVar17 != 0) goto LAB_0015bec4;
                  uVar35 = (uint)newurl;
                }
                conn->remote_port = uVar35 & 0xffff;
                (conn->primary).remote_port = uVar35 & 0xffff;
              }
              else {
                iVar17 = curl_strequal("file",part->scheme);
                if (iVar17 == 0) break;
              }
LAB_0015bec4:
              curl_url_get(u,CURLUPART_QUERY,&(data->state).up.query,0);
              uVar35 = (data->set).scope_id;
              if (uVar35 != 0) {
                conn->scope_id = uVar35;
              }
              pcVar22 = (data->set).str[0x42];
              if (pcVar22 != (char *)0x0) {
                pcVar22 = (*Curl_cstrdup)(pcVar22);
                conn->sasl_authzid = pcVar22;
                if (pcVar22 == (char *)0x0) break;
              }
              pcVar22 = (data->set).str[0x3c];
              if (pcVar22 != (char *)0x0) {
                pcVar22 = (*Curl_cstrdup)(pcVar22);
                conn->oauth_bearer = pcVar22;
                if (pcVar22 == (char *)0x0) break;
              }
              pcVar22 = (data->set).str[0x3d];
              if (pcVar22 == (char *)0x0) {
                CVar36 = conn->bits;
              }
              else {
                pcVar22 = (*Curl_cstrdup)(pcVar22);
                conn->unix_domain_socket = pcVar22;
                if (pcVar22 == (char *)0x0) break;
                CVar36 = (ConnectBits)
                         ((ulong)conn->bits & 0xfffffffffbffffff |
                         (ulong)((uint)(*(ulong *)&(data->set).field_0x894 >> 0x16) & 0x4000000));
                conn->bits = CVar36;
              }
              if (((ulong)CVar36 & 4) == 0) {
LAB_0015bff1:
                pcVar22 = (data->set).str[0x26];
                if (pcVar22 == (char *)0x0) {
                  local_b8 = (curl_slist **)0x0;
                }
                else {
                  local_b8 = (curl_slist **)(*Curl_cstrdup)(pcVar22);
                  if (local_b8 == (curl_slist **)0x0) {
                    Curl_failf(data,"memory shortage");
                    CVar18 = CURLE_OUT_OF_MEMORY;
                    goto LAB_0015c367;
                  }
                }
                pcVar22 = (data->set).str[0x27];
                if (pcVar22 == (char *)0x0) {
                  local_b0 = (char *)0x0;
LAB_0015c084:
                  if ((data->set).str[0x32] == (char *)0x0) {
                    pcVar42 = "no_proxy";
                    pcVar22 = curl_getenv("no_proxy");
                    if (pcVar22 == (char *)0x0) {
                      pcVar42 = "NO_PROXY";
                      pcVar22 = curl_getenv("NO_PROXY");
                      if (pcVar22 == (char *)0x0) goto LAB_0015c092;
                    }
                    if ((((data->set).field_0x897 & 0x40) != 0) &&
                       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar7->log_level)))) {
                      Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar42,pcVar22);
                    }
                  }
                  else {
LAB_0015c092:
                    pcVar22 = (char *)0x0;
                  }
                  pcVar42 = (data->set).str[0x32];
                  if (pcVar42 == (char *)0x0) {
                    pcVar42 = pcVar22;
                  }
                  _Var13 = Curl_check_noproxy((conn->host).name,pcVar42);
                  if (_Var13) {
                    (*Curl_cfree)(local_b8);
                    (*Curl_cfree)(local_b0);
LAB_0015c0cb:
                    local_b8 = (curl_slist **)0x0;
LAB_0015c0d3:
                    local_b0 = (char *)0x0;
                  }
                  else if (local_b8 == (curl_slist **)0x0 && local_b0 == (char *)0x0) {
                    pcVar42 = (char *)&newurl;
                    curl_msnprintf(pcVar42,0x14,"%s_proxy",conn->handler->scheme);
                    local_b8 = (curl_slist **)curl_getenv(pcVar42);
                    if (local_b8 == (curl_slist **)0x0) {
                      pcVar42 = (char *)&newurl;
                      pcVar39 = "http_proxy";
                      iVar17 = curl_strequal("http_proxy",pcVar42);
                      if (iVar17 == 0) {
                        Curl_strntoupper(pcVar42,pcVar42,0x14);
                        local_b8 = (curl_slist **)curl_getenv(pcVar42);
                        if (local_b8 != (curl_slist **)0x0) goto LAB_0015c2c4;
                      }
                      iVar17 = curl_strequal("ws_proxy",(char *)&newurl);
                      if (iVar17 == 0) {
                        pcVar42 = (char *)&newurl;
                        iVar17 = curl_strequal("wss_proxy",pcVar42);
                        if (iVar17 != 0) {
                          local_b8 = (curl_slist **)curl_getenv("https_proxy");
                          if (local_b8 != (curl_slist **)0x0) goto LAB_0015c2c4;
                          pcVar39 = "HTTPS_PROXY";
                          goto LAB_0015c405;
                        }
                      }
                      else {
LAB_0015c405:
                        local_b8 = (curl_slist **)curl_getenv(pcVar39);
                        if (local_b8 != (curl_slist **)0x0) {
                          pcVar42 = (char *)&newurl;
                          goto LAB_0015c2c4;
                        }
                      }
                      pcVar42 = "all_proxy";
                      local_b8 = (curl_slist **)curl_getenv("all_proxy");
                      if (local_b8 == (curl_slist **)0x0) {
                        pcVar42 = "ALL_PROXY";
                        local_b8 = (curl_slist **)curl_getenv("ALL_PROXY");
                        if (local_b8 == (curl_slist **)0x0) goto LAB_0015c0cb;
                      }
                    }
LAB_0015c2c4:
                    if ((((data->set).field_0x897 & 0x40) != 0) &&
                       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar7->log_level)))) {
                      Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar42,local_b8);
                    }
                    goto LAB_0015c0d3;
                  }
                  (*Curl_cfree)(pcVar22);
                  if (local_b8 == (curl_slist **)0x0) {
LAB_0015c11b:
                    local_b8 = (curl_slist **)0x0;
                  }
                  else if (((conn->unix_domain_socket != (char *)0x0) || (*(char *)local_b8 == '\0')
                           ) || ((conn->handler->flags & 0x10) != 0)) {
                    (*Curl_cfree)(local_b8);
                    goto LAB_0015c11b;
                  }
                  if (local_b0 == (char *)0x0) {
LAB_0015c17e:
                    if (local_b8 != (curl_slist **)0x0) {
                      local_74 = (curl_proxytype)(conn->http_proxy).proxytype;
                      local_b0 = (char *)0x0;
                      local_50 = 0;
LAB_0015c1b3:
                      local_58 = &conn->http_proxy;
                      CVar18 = parse_proxy(data,conn,(char *)local_b8,local_74);
                      (*Curl_cfree)(local_b8);
                      if (CVar18 == CURLE_OK) {
                        if ((char)local_50 != '\0') goto LAB_0015c331;
                        goto LAB_0015c375;
                      }
                      local_b8 = (curl_slist **)0x0;
                      goto LAB_0015c5a8;
                    }
                    uVar27 = (ulong)conn->bits & 0xfffffffffffffffc;
                  }
                  else {
                    if ((*local_b0 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
                      (*Curl_cfree)(local_b0);
                      goto LAB_0015c17e;
                    }
                    local_58 = &conn->http_proxy;
                    local_74 = (curl_proxytype)(conn->http_proxy).proxytype;
                    local_50 = 1;
                    if (local_b8 != (curl_slist **)0x0) goto LAB_0015c1b3;
LAB_0015c331:
                    CVar18 = parse_proxy(data,conn,local_b0,local_74);
                    (*Curl_cfree)(local_b0);
                    if (CVar18 != CURLE_OK) goto LAB_0015c367;
LAB_0015c375:
                    if ((local_58->host).rawalloc == (char *)0x0) {
                      CVar36 = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffff6);
                      conn->bits = CVar36;
                      if ((conn->socks_proxy).host.rawalloc == (char *)0x0) goto LAB_0015c554;
                      if ((conn->socks_proxy).user == (char *)0x0) {
                        pcVar22 = (conn->socks_proxy).passwd;
                        (conn->socks_proxy).user = (conn->http_proxy).user;
                        (conn->http_proxy).user = (char *)0x0;
                        (*Curl_cfree)(pcVar22);
                        (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
                        (conn->http_proxy).passwd = (char *)0x0;
                        CVar36 = conn->bits;
                      }
                    }
                    else {
                      CVar36 = conn->bits;
                      if ((conn->handler->protocol & 0xc0000003) == 0) {
                        if (((conn->handler->flags & 0x800) == 0) || (((ulong)CVar36 & 8) != 0)) {
                          CVar36 = (ConnectBits)((ulong)CVar36 | 8);
                        }
                        else {
                          conn->handler = &Curl_handler_http;
                        }
                      }
                      CVar36 = (ConnectBits)((ulong)CVar36 | 1);
                      if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
LAB_0015c554:
                        uVar27 = (ulong)CVar36 & 0xfffffffffffffffd;
                        goto LAB_0015c558;
                      }
                    }
                    uVar27 = (ulong)CVar36 | 2;
                  }
LAB_0015c558:
                  uVar21 = 0x10;
                  if ((uVar27 & 1) == 0) {
                    uVar21 = (ulong)((int)uVar27 * 8 & 0x10);
                  }
                  conn->bits = (ConnectBits)(uVar27 & 0xffffffffffffffef | uVar21);
                  if (uVar21 == 0) {
                    conn->bits = (ConnectBits)(uVar27 & 0xffffffffffffffe0);
                    (conn->http_proxy).proxytype = '\0';
                  }
                  local_b8 = (curl_slist **)0x0;
                  local_b0 = (char *)0x0;
                  CVar18 = CURLE_OK;
                }
                else {
                  local_b0 = (*Curl_cstrdup)(pcVar22);
                  if (local_b0 != (char *)0x0) goto LAB_0015c084;
                  local_b0 = (char *)0x0;
                  Curl_failf(data,"memory shortage");
                  CVar18 = CURLE_OUT_OF_MEMORY;
                }
              }
              else {
                pcVar22 = (data->state).aptr.proxyuser;
                pcVar42 = (data->state).aptr.proxypasswd;
                if (pcVar22 == (char *)0x0) {
                  pcVar22 = "";
                }
                pcVar22 = (*Curl_cstrdup)(pcVar22);
                (conn->http_proxy).user = pcVar22;
                CVar18 = CURLE_OUT_OF_MEMORY;
                if (pcVar22 != (char *)0x0) {
                  if (pcVar42 == (char *)0x0) {
                    pcVar42 = "";
                  }
                  pcVar22 = (*Curl_cstrdup)(pcVar42);
                  (conn->http_proxy).passwd = pcVar22;
                  if (pcVar22 != (char *)0x0) goto LAB_0015bff1;
                  (*Curl_cfree)((conn->http_proxy).user);
                  (conn->http_proxy).user = (char *)0x0;
                }
LAB_0015c367:
                local_b8 = (curl_slist **)0x0;
                local_b0 = (char *)0x0;
              }
LAB_0015c5a8:
              (*Curl_cfree)(local_b0);
              (*Curl_cfree)(local_b8);
              if (CVar18 != CURLE_OK) goto LAB_0015ba07;
              if (((conn->given->flags & 1) != 0) && (((ulong)conn->bits & 1) != 0)) {
                conn->bits = (ConnectBits)((ulong)conn->bits | 8);
              }
              uVar5 = (data->set).use_port;
              if ((uVar5 != 0) && (((data->state).field_0x7be & 0x40) != 0)) {
                conn->remote_port = (uint)uVar5;
                curl_msnprintf((char *)&newurl,0x10,"%d");
                CVar16 = curl_url_set((data->state).uh,CURLUPART_PORT,(char *)&newurl,0);
                if (CVar16 != CURLUE_OK) break;
              }
              if ((data->set).str[0x2f] != (char *)0x0) {
                (*Curl_cfree)(conn->options);
                pcVar22 = (*Curl_cstrdup)((data->set).str[0x2f]);
                conn->options = pcVar22;
                if (pcVar22 == (char *)0x0) break;
              }
              ppcVar4 = &conn->user;
              passwordp = &conn->passwd;
              if ((data->set).use_netrc == '\x02') {
                (*Curl_cfree)(*ppcVar4);
                *ppcVar4 = (char *)0x0;
                (*Curl_cfree)(*passwordp);
                *passwordp = (char *)0x0;
              }
              puVar2 = &(conn->bits).field_0x2;
              *puVar2 = *puVar2 & 0xf7;
              ppcVar41 = ppcVar4;
              if (((data->set).use_netrc == '\0') || ((data->set).str[0x2d] != (char *)0x0)) {
                pcVar22 = *ppcVar4;
                if (pcVar22 != (char *)0x0) goto LAB_0015c6ea;
LAB_0015c710:
                pcVar42 = *ppcVar3;
              }
              else {
                if (*ppcVar3 == (char *)0x0) {
                  bVar44 = false;
                }
                else {
                  bVar44 = (~*(uint *)&(data->state).field_0x7be & 3) != 0;
                  if (bVar44) {
                    ppcVar41 = ppcVar3;
                  }
                }
                if (*passwordp == (char *)0x0) {
                  ret = Curl_parsenetrc(&(data->state).netrc,(conn->host).name,ppcVar41,passwordp,
                                        (data->set).str[0x25]);
                  if (ret == NETRC_OK) {
                    if (((conn->handler->flags & 0x2000) == 0) &&
                       ((_Var13 = str_has_ctrl(*ppcVar41), _Var13 ||
                        (_Var13 = str_has_ctrl(*passwordp), _Var13)))) {
                      Curl_failf(data,"control code detected in .netrc credentials");
                      goto LAB_0015d004;
                    }
                    puVar2 = &(conn->bits).field_0x2;
                    *puVar2 = *puVar2 | 8;
                  }
                  else {
                    if ((ret != NETRC_NO_MATCH) && ((data->set).use_netrc != '\x01')) {
                      pcVar22 = Curl_netrc_strerror(ret);
                      Curl_failf(data,".netrc error: %s",pcVar22);
LAB_0015d004:
                      CVar19 = CURLE_READ_ERROR;
                      goto switchD_0015b81d_caseD_5;
                    }
                    if ((((data->set).field_0x897 & 0x40) != 0) &&
                       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar7->log_level)))) {
                      pcVar22 = (data->set).str[0x25];
                      pcVar42 = ".netrc";
                      if (pcVar22 != (char *)0x0) {
                        pcVar42 = pcVar22;
                      }
                      Curl_infof(data,"Couldn\'t find host %s in the %s file; using defaults",
                                 (conn->host).name,pcVar42);
                    }
                  }
                }
                if (bVar44) {
                  (*Curl_cfree)(*ppcVar4);
                  pcVar22 = (*Curl_cstrdup)(*ppcVar41);
                  *ppcVar4 = pcVar22;
                  if (pcVar22 == (char *)0x0) break;
                }
                pcVar22 = *ppcVar41;
                if (pcVar22 == (char *)0x0) {
                  if (*passwordp == (char *)0x0) goto LAB_0015c710;
                  pcVar22 = (*Curl_cstrdup)("");
                  *ppcVar41 = pcVar22;
                  if (pcVar22 == (char *)0x0) break;
                }
LAB_0015c6ea:
                pcVar42 = *ppcVar3;
                if (pcVar42 != pcVar22) {
                  CVar18 = Curl_setstropt(ppcVar3,pcVar22);
                  if (CVar18 != CURLE_OK) goto LAB_0015ba07;
                  puVar2 = &(data->state).field_0x7be;
                  *puVar2 = *puVar2 | 3;
                  goto LAB_0015c710;
                }
              }
              CVar19 = CURLE_UNSUPPORTED_PROTOCOL;
              if (pcVar42 != (char *)0x0) {
                CVar16 = curl_url_set((data->state).uh,CURLUPART_USER,pcVar42,0x80);
                switch(CVar16) {
                case CURLUE_OK:
                  if (*ppcVar41 == (char *)0x0) {
                    pcVar22 = (*Curl_cstrdup)(*ppcVar3);
                    *ppcVar41 = pcVar22;
                    if (pcVar22 == (char *)0x0) goto switchD_0015b81d_caseD_7;
                  }
                  break;
                default:
                  goto switchD_0015bcac_caseD_1;
                case CURLUE_UNSUPPORTED_SCHEME:
                  goto switchD_0015b81d_caseD_5;
                case CURLUE_OUT_OF_MEMORY:
                  goto switchD_0015b81d_caseD_7;
                case CURLUE_USER_NOT_ALLOWED:
                  goto switchD_0015b81d_caseD_8;
                }
              }
              if (*passwordp != (char *)0x0) {
                CVar18 = Curl_setstropt(ppcVar1,*passwordp);
                if (CVar18 != CURLE_OK) goto LAB_0015ba07;
                puVar2 = &(data->state).field_0x7be;
                *puVar2 = *puVar2 | 3;
              }
              if (*ppcVar1 != (char *)0x0) {
                CVar16 = curl_url_set((data->state).uh,CURLUPART_PASSWORD,*ppcVar1,0x80);
                switch(CVar16) {
                case CURLUE_OK:
                  if (*passwordp == (char *)0x0) {
                    pcVar22 = (*Curl_cstrdup)(*ppcVar1);
                    *passwordp = pcVar22;
                    if (pcVar22 == (char *)0x0) goto switchD_0015b81d_caseD_7;
                  }
                  goto LAB_0015c801;
                default:
                  CVar19 = CURLE_URL_MALFORMAT;
                  break;
                case CURLUE_UNSUPPORTED_SCHEME:
                  break;
                case CURLUE_OUT_OF_MEMORY:
                  goto switchD_0015b81d_caseD_7;
                case CURLUE_USER_NOT_ALLOWED:
                  goto switchD_0015b81d_caseD_8;
                }
                goto switchD_0015b81d_caseD_5;
              }
LAB_0015c801:
              if (((conn->handler->flags & 0x20) == 0) || (*ppcVar3 != (char *)0x0)) {
                pcVar22 = "";
                pcVar42 = "";
              }
              else {
                pcVar42 = "ftp@example.com";
                pcVar22 = "anonymous";
              }
              if (*ppcVar4 == (char *)0x0) {
                pcVar22 = (*Curl_cstrdup)(pcVar22);
                *ppcVar4 = pcVar22;
                if (pcVar22 == (char *)0x0) break;
              }
              if (*passwordp == (char *)0x0) {
                pcVar22 = (*Curl_cstrdup)(pcVar42);
                *passwordp = pcVar22;
                if (pcVar22 == (char *)0x0) break;
              }
              local_b8 = &(data->set).connect_to;
              uVar35 = 0xffffffff;
              pcVar22 = (char *)0x0;
LAB_0015c892:
              if (((uVar35 == 0xffffffff) && (pcVar22 == (char *)0x0)) &&
                 (pcVar6 = *local_b8, pcVar6 != (curl_slist *)0x0)) {
                pcVar22 = pcVar6->data;
                if (*pcVar22 == ':') {
                  local_68 = pcVar22 + 1;
LAB_0015c95f:
                  if (*local_68 == ':') {
                    local_68 = local_68 + 1;
                  }
                  else {
                    pcVar22 = strchr(local_68,0x3a);
                    if (((pcVar22 == (char *)0x0) ||
                        (iVar17 = Curl_str_number(&local_68,(curl_off_t *)&newurl,0xffff),
                        iVar17 != 0)) ||
                       (local_68 = pcVar22 + 1, newurl != (char *)(long)conn->remote_port))
                    goto LAB_0015ca34;
                  }
                  if (*local_68 == '\0') goto LAB_0015ca34;
                  pbVar28 = (byte *)(*Curl_cstrdup)(local_68);
                  if (pbVar28 != (byte *)0x0) {
                    __s = pbVar28;
                    pbVar40 = pbVar28;
                    if (*pbVar28 == 0x5b) {
                      pbVar43 = pbVar28 + 2;
                      pbVar40 = pbVar28 + 1;
                      for (__s = pbVar40; bVar15 = *__s, bVar15 != 0; __s = __s + 1) {
                        if ((9 < (byte)(bVar15 - 0x30)) &&
                           ((0x38 < bVar15 - 0x2e ||
                            ((0x1f8000001f81001U >> ((ulong)(bVar15 - 0x2e) & 0x3f) & 1) == 0)))) {
                          if (bVar15 != 0x25) goto LAB_0015cb34;
                          if (__s[1] - 0x32 == 0) {
                            iVar17 = 0x35 - (uint)__s[2];
                          }
                          else {
                            iVar17 = -(__s[1] - 0x32);
                          }
                          __s = pbVar43;
                          if (((iVar17 != 0) && (((data->set).field_0x897 & 0x40) != 0)) &&
                             ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                              (0 < pcVar7->log_level)))) {
                            Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.");
                          }
                          goto LAB_0015caf8;
                        }
                        pbVar43 = pbVar43 + 1;
                      }
                      goto LAB_0015cb41;
                    }
                    goto LAB_0015cb6d;
                  }
                }
                else {
                  bVar44 = (*(uint *)&conn->bits >> 10 & 1) == 0;
                  pcVar42 = "[";
                  if (bVar44) {
                    pcVar42 = "";
                  }
                  pcVar39 = "]";
                  if (bVar44) {
                    pcVar39 = "";
                  }
                  pcVar42 = curl_maprintf("%s%s%s",pcVar42,(conn->host).name,pcVar39);
                  if (pcVar42 != (char *)0x0) {
                    sVar24 = strlen(pcVar42);
                    iVar17 = curl_strnequal(pcVar22,pcVar42,sVar24);
                    (*Curl_cfree)(pcVar42);
                    if ((iVar17 != 0) && (local_68 = pcVar22 + sVar24 + 1, pcVar22[sVar24] == ':'))
                    goto LAB_0015c95f;
LAB_0015ca34:
                    pcVar22 = (char *)0x0;
                    uVar35 = 0xffffffff;
                    goto LAB_0015ca3a;
                  }
                }
                break;
              }
              if ((((uVar35 == 0xffffffff) && (pcVar22 == (char *)0x0)) &&
                  (asi = data->asi, asi != (altsvcinfo *)0x0)) &&
                 (((conn->handler->protocol == 2 &&
                   (newurl = (char *)0x0, ((data->state).http_neg.wanted & 1) != 0)) &&
                  (((data->state).http_neg.field_0x3 & 8) == 0)))) {
                pcVar22 = local_70->rawalloc;
                _Var13 = Curl_altsvc_lookup(asi,ALPN_h1,pcVar22,conn->remote_port,(altsvc **)&newurl
                                            ,(uint)(data->state).http_neg.allowed << 3 &
                                             (uint)asi->flags & 0x38);
                if (_Var13) {
                  pcVar42 = (*Curl_cstrdup)(*(char **)(newurl + 0x10));
                  if (pcVar42 == (char *)0x0) break;
                  (conn->conn_to_host).rawalloc = pcVar42;
                  (conn->conn_to_host).name = pcVar42;
                  CVar36 = conn->bits;
                  conn->bits = (ConnectBits)((ulong)CVar36 | 0x100);
                  conn->conn_to_port = (uint)*(ushort *)(newurl + 0x18);
                  conn->bits = (ConnectBits)((ulong)CVar36 | 0x380);
                  if ((((data->set).field_0x897 & 0x40) != 0) &&
                     ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar7->log_level)))) {
                    pcVar39 = Curl_alpnid2str(ALPN_h1);
                    uVar35 = conn->remote_port;
                    pcVar29 = Curl_alpnid2str(*(alpnid *)(newurl + 0x1c));
                    Curl_infof(data,"Alt-svc connecting from [%s]%s:%d to [%s]%s:%d",pcVar39,pcVar22
                               ,(ulong)uVar35,pcVar29,pcVar42,(ulong)*(ushort *)(newurl + 0x18));
                  }
                  if (*(int *)(newurl + 0x1c) == 0x10) {
                    hVar14 = '\x02';
                  }
                  else {
                    if (*(int *)(newurl + 0x1c) != 0x20) goto LAB_0015d019;
                    conn->transport = '\x05';
                    hVar14 = '\x04';
                  }
                  (data->state).http_neg.allowed = hVar14;
                  (data->state).http_neg.wanted = hVar14;
                }
              }
LAB_0015d019:
              CVar36 = conn->bits;
              if (((ulong)CVar36 & 1) != 0) {
                CVar18 = Curl_idnconvert_hostname(&(conn->http_proxy).host);
                if (CVar18 != CURLE_OK) goto LAB_0015ba07;
                CVar36 = conn->bits;
              }
              if (((ulong)CVar36 & 2) != 0) {
                CVar18 = Curl_idnconvert_hostname(&(conn->socks_proxy).host);
                if (CVar18 != CURLE_OK) goto LAB_0015ba07;
                CVar36 = conn->bits;
              }
              if ((CVar36._0_4_ >> 8 & 1) != 0) {
                CVar18 = Curl_idnconvert_hostname(&conn->conn_to_host);
                if (CVar18 != CURLE_OK) goto LAB_0015ba07;
                CVar36 = conn->bits;
                if ((CVar36._0_4_ >> 8 & 1) != 0) {
                  iVar17 = curl_strequal((conn->conn_to_host).name,(conn->host).name);
                  CVar36 = conn->bits;
                  if (iVar17 != 0) {
                    CVar36 = (ConnectBits)((ulong)CVar36 & 0xfffffffffffffeff);
                    conn->bits = CVar36;
                  }
                }
              }
              if (((CVar36._0_4_ >> 9 & 1) != 0) && (conn->conn_to_port == conn->remote_port)) {
                CVar36 = (ConnectBits)((ulong)CVar36 & 0xfffffffffffffdff);
                conn->bits = CVar36;
              }
              if (((ulong)CVar36 & 1) != 0 && ((ulong)CVar36 & 0x300) != 0) {
                conn->bits = (ConnectBits)((ulong)CVar36 | 8);
              }
              pCVar26 = conn->handler;
              if (pCVar26->setup_connection != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr *)0x0)
              {
                CVar18 = (*pCVar26->setup_connection)(data,conn);
                if (CVar18 != CURLE_OK) goto LAB_0015ba07;
                pCVar26 = conn->handler;
              }
              uVar35 = (conn->primary).remote_port;
              if ((int)uVar35 < 0) {
                uVar35 = pCVar26->defport;
                (conn->primary).remote_port = uVar35;
              }
              uVar27 = (ulong)uVar35;
              uVar35 = SUB84(conn->bits,0);
              lVar30 = 0x108;
              if ((uVar35 & 9) != 1) {
                uVar27 = (ulong)(uint)conn->remote_port;
                lVar30 = 0xb0;
                if ((uVar35 >> 8 & 1) == 0) {
                  lVar30 = 0x80;
                }
              }
              pcVar22 = curl_maprintf("%u/%d/%s",(ulong)conn->scope_id,uVar27,
                                      *(undefined8 *)((long)&(conn->cpool_node)._list + lVar30));
              conn->destination = pcVar22;
              CVar19 = CURLE_OUT_OF_MEMORY;
              if (pcVar22 == (char *)0x0) goto switchD_0015b81d_caseD_5;
              sVar24 = strlen(pcVar22);
              Curl_strntolower(pcVar22,pcVar22,sVar24);
              pCVar26 = conn->handler;
              if ((pCVar26->flags & 0x10) == 0) {
                conn->recv[0] = Curl_cf_recv;
                conn->send[0] = Curl_cf_send;
                conn->recv[1] = Curl_cf_recv;
                conn->send[1] = Curl_cf_send;
                conn->bits = (ConnectBits)
                             ((ulong)conn->bits & 0xffffffffff7fffff |
                             (ulong)((uint)(*(ulong *)&(data->set).field_0x894 >> 0x12) & 0x800000))
                ;
                CVar18 = Curl_ssl_easy_config_complete(data);
                if (CVar18 != CURLE_OK) goto LAB_0015ba07;
                Curl_cpool_prune_dead(data);
                uVar27 = *(ulong *)&(data->set).field_0x894;
                if ((uVar27 >> 0x20 & 1) == 0) {
                  if ((uVar27 & 1) != 0) {
                    bVar15 = 0;
                    goto LAB_0015d67b;
                  }
LAB_0015d342:
                  newurl = (char *)0x0;
                  uStack_80 = 0;
                  pCStack_90 = data;
                  local_88 = conn;
                  if (((((conn->handler->protocol & 0xc0000003) == 0) ||
                       ((~*(uint *)&conn->bits & 0x2020) == 0)) ||
                      (_Var13 = Curl_multiplex_wanted(data->multi), !_Var13)) ||
                     (bVar15 = 1, ((data->state).http_neg.allowed & 6) == 0)) {
                    bVar15 = 0;
                  }
                  if (((data->state).authhost.want & 8) == 0) {
                    bVar34 = 0;
                  }
                  else {
                    bVar34 = ((conn->handler->protocol & 0xc0000003) != 0) * '\x02';
                  }
                  if ((((ulong)conn->bits & 4) == 0) || (((data->state).authproxy.want & 8) == 0)) {
                    bVar37 = 0;
                  }
                  else {
                    bVar37 = ((conn->handler->protocol & 0xc0000003) != 0) << 2;
                  }
                  uStack_80 = CONCAT71(uStack_80._1_7_,bVar34 | bVar15 | bVar37);
                  _Var13 = Curl_cpool_find(data,conn->destination,url_match_conn,url_match_result,
                                           &newurl);
                  conn_00 = (connectdata *)newurl;
                  if (!_Var13) {
                    bVar15 = (byte)uStack_80 >> 3;
                    goto LAB_0015d67b;
                  }
                  if ((conn->given->flags & 1) == 0) {
                    _Var13 = Curl_conn_is_ssl(conn,0);
                    local_48 = "";
                    if (_Var13) {
                      local_48 = " (upgraded to SSL)";
                    }
                  }
                  if (*ppcVar4 != (char *)0x0) {
                    (*Curl_cfree)(*(void **)((long)conn_00 + 0x1f8));
                    (*Curl_cfree)(*(void **)((long)conn_00 + 0x200));
                    pcVar22 = conn->passwd;
                    *(char **)((long)conn_00 + 0x1f8) = *ppcVar4;
                    *(char **)((long)conn_00 + 0x200) = pcVar22;
                    *ppcVar4 = (char *)0x0;
                    conn->passwd = (char *)0x0;
                  }
                  uVar27 = (ulong)(SUB84(conn->bits,0) & 4);
                  *(ulong *)((long)conn_00 + 0x3a0) =
                       *(ulong *)((long)conn_00 + 0x3a0) & 0xfffffffffffffffb | uVar27;
                  if (uVar27 != 0) {
                    (*Curl_cfree)(*(void **)((long)conn_00 + 0x120));
                    (*Curl_cfree)(*(void **)((long)conn_00 + 0xe8));
                    (*Curl_cfree)(*(void **)((long)conn_00 + 0x128));
                    (*Curl_cfree)(*(void **)((long)conn_00 + 0xf0));
                    pcVar22 = (conn->http_proxy).passwd;
                    *(char **)((long)conn_00 + 0x120) = (conn->http_proxy).user;
                    *(char **)((long)conn_00 + 0x128) = pcVar22;
                    pcVar22 = (conn->socks_proxy).passwd;
                    *(char **)((long)conn_00 + 0xe8) = (conn->socks_proxy).user;
                    *(char **)((long)conn_00 + 0xf0) = pcVar22;
                    (conn->socks_proxy).user = (char *)0x0;
                    (conn->socks_proxy).passwd = (char *)0x0;
                    (conn->http_proxy).user = (char *)0x0;
                    (conn->http_proxy).passwd = (char *)0x0;
                  }
                  (*Curl_cfree)(*(void **)((long)conn_00 + 0x70));
                  *(char *)((long)conn_00 + 0x70) = '\0';
                  *(char *)((long)conn_00 + 0x71) = '\0';
                  *(char *)((long)conn_00 + 0x72) = '\0';
                  *(char *)((long)conn_00 + 0x73) = '\0';
                  *(char *)((long)conn_00 + 0x74) = '\0';
                  *(char *)((long)conn_00 + 0x75) = '\0';
                  *(char *)((long)conn_00 + 0x76) = '\0';
                  *(char *)((long)conn_00 + 0x77) = '\0';
                  (*Curl_cfree)(*(void **)((long)conn_00 + 0xa0));
                  *(char *)((long)conn_00 + 0xa0) = '\0';
                  *(char *)((long)conn_00 + 0xa1) = '\0';
                  *(char *)((long)conn_00 + 0xa2) = '\0';
                  *(char *)((long)conn_00 + 0xa3) = '\0';
                  *(char *)((long)conn_00 + 0xa4) = '\0';
                  *(char *)((long)conn_00 + 0xa5) = '\0';
                  *(char *)((long)conn_00 + 0xa6) = '\0';
                  *(char *)((long)conn_00 + 0xa7) = '\0';
                  pcVar22 = local_70->encalloc;
                  pcVar42 = local_70->name;
                  pcVar39 = local_70->dispname;
                  *(char **)((long)conn_00 + 0x70) = local_70->rawalloc;
                  *(char **)((long)conn_00 + 0x78) = pcVar22;
                  *(char **)((long)conn_00 + 0x80) = pcVar42;
                  *(char **)((long)conn_00 + 0x88) = pcVar39;
                  local_70->rawalloc = (char *)0x0;
                  local_70->encalloc = (char *)0x0;
                  pcVar22 = (conn->conn_to_host).rawalloc;
                  pcVar42 = (conn->conn_to_host).encalloc;
                  pcVar39 = (conn->conn_to_host).dispname;
                  *(char **)((long)conn_00 + 0xb0) = (conn->conn_to_host).name;
                  *(char **)((long)conn_00 + 0xb8) = pcVar39;
                  *(char **)((long)conn_00 + 0xa0) = pcVar22;
                  *(char **)((long)conn_00 + 0xa8) = pcVar42;
                  (conn->conn_to_host).rawalloc = (char *)0x0;
                  *(undefined8 *)((long)conn_00 + 0x560) = *(undefined8 *)&conn->remote_port;
                  (*Curl_cfree)(*(void **)((long)conn_00 + 0x90));
                  *(char **)((long)conn_00 + 0x90) = conn->hostname_resolve;
                  conn->hostname_resolve = (char *)0x0;
                  *(byte *)((long)conn_00 + 0x3a0) = *(byte *)((long)conn_00 + 0x3a0) | 0x40;
                  Curl_conn_free(data,conn);
                  if ((((data->set).field_0x897 & 0x40) != 0) &&
                     ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar7->log_level)))) {
                    pcVar22 = "proxy";
                    if ((*(byte *)((long)conn_00 + 0x3a0) & 0x10) == 0) {
                      pcVar22 = "host";
                    }
                    lVar30 = 0xd8;
                    if ((*(long *)((long)conn_00 + 0xd0) == 0) &&
                       (lVar30 = 0x110, *(long *)((long)conn_00 + 0x108) == 0)) {
                      lVar30 = 0x88;
                    }
                    Curl_infof(data,"Re-using existing %s: connection%s with %s %s",
                               **(undefined8 **)((long)conn_00 + 0x3b0),local_48,pcVar22,
                               *(undefined8 *)((long)conn_00 + lVar30));
                  }
LAB_0015d652:
                  Curl_init_do(data,conn_00);
                  CVar19 = setup_range(data);
                  conn = conn_00;
                  if (CVar19 != CURLE_OK) goto switchD_0015b81d_caseD_5;
                  if (((ulong)conn_00->bits & 0x40) == 0) {
                    tVar31 = Curl_timeleft(data,(curltime *)0x0,true);
                    pcVar22 = conn_00->unix_domain_socket;
                    if (pcVar22 == (char *)0x0) {
                      CVar36 = conn_00->bits;
                      if (((ulong)CVar36 & 0x10) == 0) {
                        lVar30 = 0xa0;
                        if ((CVar36._0_4_ >> 8 & 1) == 0) {
                          lVar30 = 0x70;
                        }
                        (conn_00->primary).remote_port =
                             *(int *)((long)&conn_00->remote_port + (ulong)(CVar36._0_4_ >> 7 & 4));
                        pcVar22 = "host";
                      }
                      else {
                        pcVar22 = (conn_00->socks_proxy).host.name;
                        if ((pcVar22 != (char *)0x0) &&
                           (iVar17 = strncmp("localhost/",pcVar22,10), iVar17 == 0)) {
                          pcVar22 = pcVar22 + 9;
                          goto LAB_0015d862;
                        }
                        lVar30 = 0xc0;
                        if (((ulong)CVar36 & 2) == 0) {
                          lVar30 = 0xf8;
                        }
                        pcVar22 = "proxy";
                      }
                      pcVar42 = (*Curl_cstrdup)(*(char **)((long)&(conn_00->cpool_node)._prev +
                                                          lVar30));
                      conn_00->hostname_resolve = pcVar42;
                      CVar19 = CURLE_OUT_OF_MEMORY;
                      if (pcVar42 == (char *)0x0) goto switchD_0015b81d_caseD_5;
                      rVar20 = Curl_resolv_timeout(data,pcVar42,(conn_00->primary).remote_port,
                                                   &conn_00->dns_entry,tVar31);
                      if (rVar20 == CURLRESOLV_TIMEDOUT) {
                        uVar8 = *(undefined8 *)((long)&(conn_00->cpool_node)._next + lVar30);
                        cVar45 = Curl_now();
                        uVar9 = (data->progress).t_startsingle.tv_sec;
                        uVar10 = (data->progress).t_startsingle.tv_usec;
                        older.tv_usec = uVar10;
                        older.tv_sec = uVar9;
                        newer._12_4_ = 0;
                        newer.tv_sec = SUB128(cVar45._0_12_,0);
                        newer.tv_usec = SUB124(cVar45._0_12_,8);
                        older._12_4_ = 0;
                        tVar31 = Curl_timediff(newer,older);
                        Curl_failf(data,"Failed to resolve %s \'%s\' with timeout after %ld ms",
                                   pcVar22,uVar8,tVar31);
                        CVar19 = CURLE_OPERATION_TIMEDOUT;
                        goto switchD_0015b81d_caseD_5;
                      }
                      if (rVar20 == CURLRESOLV_PENDING) {
                        *local_60 = true;
                      }
                      else if (conn_00->dns_entry == (Curl_dns_entry *)0x0) {
                        Curl_failf(data,"Could not resolve %s: %s",pcVar22,
                                   *(undefined8 *)((long)&(conn_00->cpool_node)._next + lVar30));
                        CVar19 = CURLE_COULDNT_RESOLVE_HOST;
                        goto switchD_0015b81d_caseD_5;
                      }
                    }
                    else {
LAB_0015d862:
                      conn_00->transport = '\x06';
                      newurl = (char *)((ulong)newurl & 0xffffffffffffff00);
                      pCVar32 = (Curl_dns_entry *)(*Curl_ccalloc)(1,0x20);
                      if (pCVar32 == (Curl_dns_entry *)0x0) break;
                      pCVar33 = Curl_unix2addr(pcVar22,(_Bool *)&newurl,
                                               (_Bool)((byte)((uint)*(undefined4 *)&conn_00->bits >>
                                                             0x1a) & 1));
                      pCVar32->addr = pCVar33;
                      if (pCVar33 == (Curl_addrinfo *)0x0) {
                        if ((char)newurl == '\x01') {
                          Curl_failf(data,"Unix socket path too long: \'%s\'",pcVar22);
                        }
                        (*Curl_cfree)(pCVar32);
                        CVar19 = CURLE_OUT_OF_MEMORY;
                        if ((char)newurl != '\0') {
                          CVar19 = CURLE_COULDNT_RESOLVE_HOST;
                        }
                        goto switchD_0015b81d_caseD_5;
                      }
                      pCVar32->refcount = 1;
                      conn_00->dns_entry = pCVar32;
                    }
                  }
                  else {
                    *local_60 = false;
                  }
                  pCVar26 = conn_00->handler;
                  (data->info).conn_scheme = pCVar26->scheme;
                  (data->info).conn_protocol = pCVar26->protocol & 0x3ffffff;
                  (data->info).field_0xf4 =
                       (data->info).field_0xf4 & 0xfd | *(byte *)&conn_00->bits >> 3 & 2;
                  CVar18 = Curl_conn_ev_data_setup(data);
                  goto LAB_0015d2d5;
                }
                bVar15 = 0;
                if (((uVar27 & 1) == 0) && ((data->state).followlocation != 0)) goto LAB_0015d342;
LAB_0015d67b:
                if (((conn->handler->flags & 0x100) != 0) && (((data->set).field_0x899 & 4) != 0)) {
                  puVar2 = &(conn->bits).field_0x3;
                  *puVar2 = *puVar2 | 1;
                }
                if ((bVar15 & 1) != 0) {
                  if ((((data->set).field_0x897 & 0x40) == 0) ||
                     ((pcVar7 = (data->state).feat, pcVar7 != (curl_trc_feat *)0x0 &&
                      (pcVar7->log_level < 1)))) goto LAB_0015d705;
                  pcVar22 = "Waiting on connection to negotiate possible multiplexing.";
LAB_0015d6fb:
                  Curl_infof(data,pcVar22);
LAB_0015d705:
                  Curl_conn_free(data,conn);
                  return CURLE_NO_CONNECTION_AVAILABLE;
                }
                iVar17 = Curl_cpool_check_limits(data,conn);
                if (iVar17 == 2) {
                  uVar35 = (uint)*(undefined8 *)&(data->set).field_0x894;
                  if ((data->set).dohfor_mid < 0) {
                    if (((uVar35 >> 0x1e & 1) != 0) &&
                       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar7->log_level)))) {
                      Curl_infof(data,"No connections available, total of %ld reached.",
                                 data->multi->max_total_connections);
                    }
                    goto LAB_0015d705;
                  }
                  if (((uVar35 >> 0x1e & 1) != 0) &&
                     ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar7->log_level)))) {
                    Curl_infof(data,"Allowing DoH to override max connection limit");
                  }
                }
                else if (iVar17 == 1) {
                  if ((((data->set).field_0x897 & 0x40) == 0) ||
                     ((pcVar7 = (data->state).feat, pcVar7 != (curl_trc_feat *)0x0 &&
                      (pcVar7->log_level < 1)))) goto LAB_0015d705;
                  pcVar22 = "No more connections allowed to host";
                  goto LAB_0015d6fb;
                }
                CVar18 = Curl_ssl_conn_config_init(data,conn);
                if (CVar18 == CURLE_OK) {
                  Curl_attach_connection(data,conn);
                  CVar18 = Curl_cpool_add(data,conn);
                  if (CVar18 == CURLE_OK) {
                    if ((((data->state).authhost.picked & 8) != 0) &&
                       (bVar15 = (data->state).authhost.field_0x18, (bVar15 & 1) != 0)) {
                      if ((((data->set).field_0x897 & 0x40) != 0) &&
                         ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                          (0 < pcVar7->log_level)))) {
                        Curl_infof(data,"NTLM picked AND auth done set, clear picked");
                        bVar15 = (data->state).authhost.field_0x18;
                      }
                      (data->state).authhost.picked = 0;
                      (data->state).authhost.field_0x18 = bVar15 & 0xfe;
                    }
                    conn_00 = conn;
                    if ((((data->state).authproxy.picked & 8) != 0) &&
                       (bVar15 = (data->state).authproxy.field_0x18, (bVar15 & 1) != 0)) {
                      if ((((data->set).field_0x897 & 0x40) != 0) &&
                         ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                          (0 < pcVar7->log_level)))) {
                        Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked");
                        bVar15 = (data->state).authproxy.field_0x18;
                      }
                      (data->state).authproxy.picked = 0;
                      (data->state).authproxy.field_0x18 = bVar15 & 0xfe;
                    }
                    goto LAB_0015d652;
                  }
                }
              }
              else {
                (data->info).conn_scheme = pCVar26->scheme;
                (data->info).conn_protocol = pCVar26->protocol & 0x3ffffff;
                CVar18 = (*pCVar26->connect_it)(data,(_Bool *)&newurl);
                if (CVar18 == CURLE_OK) {
                  Curl_attach_connection(data,conn);
                  CVar19 = Curl_cpool_add(data,conn);
                  if ((CVar19 == CURLE_OK) && (CVar19 = setup_range(data), CVar19 == CURLE_OK)) {
                    Curl_xfer_setup_nop(data);
                    goto LAB_0015d285;
                  }
                  CVar18 = CVar19;
                  (*conn->handler->done)(data,CVar18,false);
                }
                else {
LAB_0015d285:
                  Curl_init_do(data,conn);
                }
LAB_0015d2d5:
                if (CVar18 == CURLE_OK) {
                  sVar23 = Curl_llist_count(&conn->easyq);
                  if (1 < sVar23) {
                    *local_40 = true;
                    return CURLE_OK;
                  }
                  if (*local_60 != false) {
                    return CURLE_OK;
                  }
                  CVar18 = Curl_setup_conn(data,local_40);
                }
              }
LAB_0015ba07:
              CVar19 = CVar18;
              if (CVar18 == CURLE_NO_CONNECTION_AVAILABLE) {
                return CURLE_NO_CONNECTION_AVAILABLE;
              }
              goto switchD_0015b81d_caseD_5;
            default:
              goto switchD_0015bcac_caseD_1;
            case CURLUE_UNSUPPORTED_SCHEME:
              goto switchD_0015b81d_caseD_5;
            case CURLUE_OUT_OF_MEMORY:
              break;
            case CURLUE_USER_NOT_ALLOWED:
              goto switchD_0015b81d_caseD_8;
            }
          default:
            if (CVar16 != CURLUE_OK) goto switchD_0015bcac_caseD_1;
            pcVar22 = (*Curl_cstrdup)(*ppcVar4);
            conn->options = pcVar22;
            if (pcVar22 != (char *)0x0) goto switchD_0015bd3e_caseD_d;
          }
          goto switchD_0015b81d_caseD_7;
        }
      }
      pcVar39 = " (in redirect)";
      if (((data->state).field_0x7be & 8) == 0) {
        pcVar39 = "";
      }
      Curl_failf(data,"Protocol \"%s\" %s%s",pcVar22,pcVar42,pcVar39);
      goto switchD_0015b81d_caseD_5;
    }
    iVar17 = curl_strequal("file",part->scheme);
    if (iVar17 != 0) {
      pcVar22 = *ppcVar1;
      goto LAB_0015b987;
    }
switchD_0015b81d_caseD_7:
    CVar19 = CURLE_OUT_OF_MEMORY;
switchD_0015b81d_caseD_5:
    if ((CVar19 != CURLE_OK) && (conn != (connectdata *)0x0)) {
      Curl_detach_connection(data);
      Curl_conn_terminate(data,conn,true);
    }
    return CVar19;
  default:
    goto switchD_0015b81d_caseD_1;
  case CURLUE_UNSUPPORTED_SCHEME:
    goto switchD_0015b81d_caseD_5;
  case CURLUE_OUT_OF_MEMORY:
    goto switchD_0015b81d_caseD_7;
  case CURLUE_USER_NOT_ALLOWED:
switchD_0015b81d_caseD_8:
    CVar19 = CURLE_LOGIN_DENIED;
    goto switchD_0015b81d_caseD_5;
  }
LAB_0015caf8:
  bVar15 = *__s;
  if (bVar15 == 0) goto LAB_0015cb41;
  if ((((9 < (byte)(bVar15 - 0x30)) && (0x19 < (byte)((bVar15 & 0xdf) + 0xbf))) &&
      (1 < bVar15 - 0x2d)) && ((bVar15 != 0x7e && (bVar15 != 0x5f)))) goto LAB_0015cb34;
  __s = __s + 1;
  goto LAB_0015caf8;
LAB_0015cb34:
  if (bVar15 == 0x5d) {
    *__s = 0;
    __s = __s + 1;
  }
  else {
LAB_0015cb41:
    if ((((data->set).field_0x897 & 0x40) != 0) &&
       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)))) {
      Curl_infof(data,"Invalid IPv6 address format");
    }
  }
LAB_0015cb6d:
  pcVar22 = strchr((char *)__s,0x3a);
  uVar35 = 0xffffffff;
  if ((pcVar22 == (char *)0x0) || (*pcVar22 = '\0', pcVar22[1] == '\0')) {
LAB_0015cbd7:
    pcVar22 = (*Curl_cstrdup)((char *)pbVar40);
    CVar18 = CURLE_OK;
    if (pcVar22 == (char *)0x0) {
      CVar18 = CURLE_OUT_OF_MEMORY;
      goto LAB_0015cc04;
    }
    bVar44 = true;
  }
  else {
    local_38 = pcVar22 + 1;
    iVar17 = Curl_str_number(&local_38,(curl_off_t *)&newurl,0xffff);
    if (iVar17 == 0) {
      uVar35 = (uint)newurl;
      goto LAB_0015cbd7;
    }
    Curl_failf(data,"No valid port number in connect to host string (%s)",pcVar22 + 1);
    CVar18 = CURLE_SETOPT_OPTION_SYNTAX;
LAB_0015cc04:
    uVar35 = 0xffffffff;
    pcVar22 = (char *)0x0;
    bVar44 = false;
  }
  (*Curl_cfree)(pbVar28);
  if (!bVar44) goto LAB_0015d2d5;
  if (pcVar22 == (char *)0x0) {
    pcVar22 = (char *)0x0;
  }
  else if (*pcVar22 != '\0') {
    (conn->conn_to_host).rawalloc = pcVar22;
    (conn->conn_to_host).name = pcVar22;
    puVar2 = &(conn->bits).field_0x1;
    *puVar2 = *puVar2 | 1;
    if ((((data->set).field_0x897 & 0x40) != 0) &&
       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)))) {
      Curl_infof(data,"Connecting to hostname: %s",pcVar22);
    }
    goto LAB_0015ca51;
  }
LAB_0015ca3a:
  puVar2 = &(conn->bits).field_0x1;
  *puVar2 = *puVar2 & 0xfe;
  (*Curl_cfree)(pcVar22);
  pcVar22 = (char *)0x0;
LAB_0015ca51:
  if ((int)uVar35 < 0) {
    puVar2 = &(conn->bits).field_0x1;
    *puVar2 = *puVar2 & 0xfd;
    uVar35 = 0xffffffff;
  }
  else {
    conn->conn_to_port = uVar35;
    puVar2 = &(conn->bits).field_0x1;
    *puVar2 = *puVar2 | 2;
    if ((((data->set).field_0x897 & 0x40) != 0) &&
       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)))) {
      Curl_infof(data,"Connecting to port: %d",(ulong)uVar35);
    }
  }
  local_b8 = &pcVar6->next;
  goto LAB_0015c892;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* Set the request to virgin state based on transfer settings */
  Curl_req_hard_reset(&data->req, data);

  /* call the stuff that needs to be called */
  result = create_conn(data, &conn, asyncp);

  if(!result) {
    if(CONN_INUSE(conn) > 1)
      /* multiplexed */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that is either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(data, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    return result;
  }
  else if(result && conn) {
    /* We are not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_detach_connection(data);
    Curl_conn_terminate(data, conn, TRUE);
  }

  return result;
}